

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

void __thiscall libDAI::TRW::calcNewMessage(TRW *this,size_t iI)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar3;
  undefined4 extraout_var_02;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *pvVar4;
  long lVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TFactor<double> *this_00;
  const_iterator cVar6;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  pointer pVVar7;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  Var *n;
  Exception *pEVar8;
  long lVar9;
  long lVar10;
  pointer pTVar11;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 extraout_var_14 [56];
  VarSet v_J;
  Prob prod_j;
  Var v_j;
  Factor prod;
  VarSet v_I;
  Var v_k;
  Var v_i;
  string local_188;
  pointer local_168;
  long local_160;
  TFactor<double> local_158;
  long local_120;
  TProb<double> local_118;
  WeightedGraph<double> *local_100;
  Var local_f8;
  undefined1 local_e0 [32];
  pointer local_c0;
  pointer local_b0;
  VarSet local_a8;
  pointer local_88;
  size_t local_80;
  VarSet local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  Var local_48;
  undefined1 auVar13 [64];
  
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  pVVar7 = *(pointer *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x40) + iI * 0x10);
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar5 = *(long *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x40) + 8 + iI * 0x10);
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x30))
                             ((long *)CONCAT44(extraout_var_01,iVar2),pVVar7);
  local_48._label = *plVar3;
  local_48._states = plVar3[1];
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  local_120 = lVar5;
  pvVar4 = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x50))
                     ((long *)CONCAT44(extraout_var_02,iVar2),lVar5);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector(&local_78._vars,pvVar4);
  local_78._statespace =
       (size_t)pvVar4[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
  lVar5 = (long)local_78._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)local_78._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                .super__Vector_impl_data._M_start >> 4;
  if (lVar5 == 2) {
    VarSet::VarSet(&local_158._vs,&local_48);
    VarSet::operator/((VarSet *)local_e0,&local_78,&local_158._vs);
    local_f8._label = *(long *)local_e0._0_8_;
    local_f8._states = *(size_t *)(local_e0._0_8_ + 8);
    if ((pointer)local_e0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
    }
    if (local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    local_168 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x40))
                                   ((long *)CONCAT44(extraout_var_04,iVar2),&local_f8);
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_05,iVar2),local_120);
    auVar13._8_56_ = extraout_var_14;
    auVar13._0_8_ = extraout_XMM1_Qa;
    auVar12 = auVar13._0_16_;
    local_100 = &this->_rho_e;
    local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = local_168;
    local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar7;
    cVar6 = std::
            _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                    *)local_100,(key_type *)&local_158);
    TFactor<double>::operator^
              ((TFactor<double> *)local_e0,this_00,1.0 / (double)cVar6._M_node[1]._M_left);
    auVar12 = vcvtusi2sd_avx512f(auVar12,local_f8._states);
    local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(1.0 / auVar12._0_8_);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_118._p,local_f8._states,(value_type_conflict3 *)&local_158,
               (allocator_type *)&local_188);
    local_88 = pVVar7;
    local_80 = iI;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    local_160 = (long)local_168 * 3;
    plVar3 = *(long **)(*(long *)(CONCAT44(extraout_var_06,iVar2) + 0x70) + (long)local_168 * 0x18);
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if (plVar3 == *(long **)(*(long *)(CONCAT44(extraout_var_07,iVar2) + 0x70) + 8 + local_160 * 8
                              )) break;
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pvVar4 = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0x50))
                         ((long *)CONCAT44(extraout_var_08,iVar2),*plVar3);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_158,pvVar4);
      local_158._vs._statespace =
           (size_t)pvVar4[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start;
      lVar5 = (long)local_158._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      if (lVar5 == 2) {
        VarSet::VarSet(&local_a8,&local_f8);
        VarSet::operator/((VarSet *)&local_188,&local_158._vs,&local_a8);
        local_58 = *(undefined8 *)local_188._M_dataplus._M_p;
        uStack_50 = *(undefined8 *)(local_188._M_dataplus._M_p + 8);
        if (local_188._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_188._M_dataplus._M_p,
                          local_188.field_2._M_allocated_capacity - (long)local_188._M_dataplus._M_p
                         );
        }
        if (local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        pVVar7 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar2) + 0x40))
                                    ((long *)CONCAT44(extraout_var_10,iVar2),&local_58);
        if (*plVar3 == local_120) {
          lVar5 = *plVar3;
          iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar5 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar2) + 0x58) +
                                     local_160 * 8) + lVar5 * 8);
          pTVar11 = (this->_messages).
                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = local_168;
          local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar7;
          cVar6 = std::
                  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                          *)local_100,(key_type *)&local_a8);
          TProb<double>::operator^
                    ((TProb<double> *)&local_188,pTVar11 + lVar5,
                     (double)cVar6._M_node[1]._M_left + -1.0);
          if ((long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar5 = (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3;
            lVar9 = 0;
            do {
              local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] =
                   *(double *)(local_188._M_dataplus._M_p + lVar9 * 8) *
                   local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
          }
        }
        else {
          lVar5 = *plVar3;
          iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar5 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_12,iVar2) + 0x58) +
                                     local_160 * 8) + lVar5 * 8);
          pTVar11 = (this->_messages).
                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = local_168;
          local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar7;
          cVar6 = std::
                  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                          *)local_100,(key_type *)&local_a8);
          TProb<double>::operator^
                    ((TProb<double> *)&local_188,pTVar11 + lVar5,(Real)cVar6._M_node[1]._M_left);
          if ((long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar5 = (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3;
            lVar9 = 0;
            do {
              local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] =
                   *(double *)(local_188._M_dataplus._M_p + lVar9 * 8) *
                   local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
          }
        }
        if (local_188._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_188._M_dataplus._M_p,
                          local_188.field_2._M_allocated_capacity - (long)local_188._M_dataplus._M_p
                         );
        }
      }
      else {
        if (lVar5 != 1) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x10);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_188,"trw.cpp, line 197","");
          Exception::Exception(pEVar8,0,&local_188);
          __cxa_throw(pEVar8,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = *plVar3;
        iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar9 = (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          lVar5 = *(long *)&(this->_messages).
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_09,iVar2) + 0x58) +
                                                local_160 * 8) + lVar5 * 8)]._p.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl;
          lVar10 = 0;
          do {
            local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] =
                 *(double *)(lVar5 + lVar10 * 8) *
                 local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
        }
      }
      if (local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      plVar3 = plVar3 + 1;
    }
    VarSet::VarSet((VarSet *)&local_188,&local_f8);
    TFactor<double>::TFactor(&local_158,(VarSet *)&local_188,&local_118);
    sVar1 = local_80;
    pVVar7 = local_88;
    TFactor<double>::operator*=((TFactor<double> *)local_e0,&local_158);
    if (local_158._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_188._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_188._M_dataplus._M_p,
                      local_188.field_2._M_allocated_capacity - (long)local_188._M_dataplus._M_p);
    }
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_13,iVar2) + 0x30))
                         ((long *)CONCAT44(extraout_var_13,iVar2),pVVar7);
    VarSet::VarSet((VarSet *)&local_188,n);
    TFactor<double>::marginal(&local_158,(TFactor<double> *)local_e0,(VarSet *)&local_188,true);
    pTVar11 = (this->_newmessages).
              super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start + sVar1;
    if (pTVar11 != &local_158._p) {
      std::vector<double,_std::allocator<double>_>::operator=(&pTVar11->_p,&local_158._p._p);
    }
    if (local_158._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_188._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_188._M_dataplus._M_p,
                      local_188.field_2._M_allocated_capacity - (long)local_188._M_dataplus._M_p);
    }
    if (local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_118._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_c0 != (pointer)0x0) {
      operator_delete(local_c0,(long)local_b0 - (long)local_c0);
    }
    if ((pointer)local_e0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
    }
  }
  else {
    if (lVar5 != 1) {
      pEVar8 = (Exception *)__cxa_allocate_exception(0x10);
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"trw.cpp, line 203","");
      Exception::Exception(pEVar8,0,(string *)local_e0);
      __cxa_throw(pEVar8,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                      ((long *)CONCAT44(extraout_var_03,iVar2),local_120);
    pTVar11 = (this->_newmessages).
              super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start + iI;
    if (pTVar11 != (pointer)(lVar5 + 0x20)) {
      std::vector<double,_std::allocator<double>_>::operator=
                (&pTVar11->_p,(vector<double,_std::allocator<double>_> *)(lVar5 + 0x20));
    }
  }
  if (local_78._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TRW::calcNewMessage (size_t iI) {
        // calculate updated message I->i
        size_t i = grm().edge(iI).first;
        size_t I = grm().edge(iI).second;
        Var v_i = grm().var(i);

        VarSet v_I = grm().factor(I).vars();
        if( v_I.size() == 1 ) {
            _newmessages[iI] = grm().factor(I).p();
        } else if( v_I.size() == 2 ) {
            Var v_j = *((v_I / v_i).begin());
            size_t j = grm().findVar( v_j );

            Factor prod = grm().factor(I)^(1.0 / rho(i,j));

            Prob prod_j( v_j.states() );
            for( FactorGraph::nb_cit J = grm().nbV(j).begin(); J != grm().nbV(j).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 )
                    prod_j *= message(j,*J);
                else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_j).begin());
                    size_t k = grm().findVar( v_k );
                    if( *J == I )
                        prod_j *= message(j,*J)^(rho(j,k) - 1.0);
                    else
                        prod_j *= message(j,*J)^rho(j,k);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }
            prod *= Factor( v_j, prod_j );

            _newmessages[iI] = prod.marginal(grm().var(i)).p();
        } else
            DAI_THROW(NOT_IMPLEMENTED);
    }